

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void mxx::custom_op<long>::custom_function<std::bit_xor<long>>
               (long param_1,long param_2,int *param_3,undefined8 *param_4)

{
  ulong *puVar1;
  void *__src;
  int iVar2;
  ulong uVar3;
  long inout_buf;
  long in_buf;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  ulong local_50;
  ulong local_48;
  long local_40;
  size_t local_38;
  
  iVar2 = *param_3;
  if (1 < iVar2) {
    uVar3 = 0;
    do {
      puVar1 = (ulong *)(param_2 + uVar3 * 8);
      *puVar1 = *puVar1 ^ *(ulong *)(param_1 + uVar3 * 8);
      uVar3 = uVar3 + 1;
    } while (iVar2 - 1 != uVar3);
  }
  MPI_Type_get_true_extent(*param_4,&local_40,&local_38);
  iVar2 = *param_3;
  memcpy((void *)((long)&local_48 + local_40),(void *)(param_1 + (long)iVar2 * 8 + -8),local_38);
  __src = (void *)(param_2 + -8 + (long)iVar2 * 8);
  memcpy((void *)((long)&local_50 + local_40),__src,local_38);
  local_50 = local_50 ^ local_48;
  memcpy(__src,(void *)((long)&local_50 + local_40),local_38);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }